

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_x509.cc
# Opt level: O3

X509 * x509_parse(CBS *cbs,CRYPTO_BUFFER *buf)

{
  int iVar1;
  X509 *a;
  X509_ALGOR *pXVar2;
  ASN1_BIT_STRING *pAVar3;
  ulong uVar4;
  X509_CINF *pXVar5;
  int line;
  uint8_t *inp;
  int indefinite;
  CBS_ASN1_TAG tag;
  CBS sig;
  CBS cert;
  CBS sigalg;
  CBS tbs;
  size_t header_len;
  
  iVar1 = CBS_get_asn1(cbs,&cert,0x20000010);
  if ((((iVar1 == 0) || (0x3fffffff < cert.len)) ||
      (iVar1 = CBS_get_asn1_element(&cert,&tbs,0x20000010), iVar1 == 0)) ||
     (iVar1 = CBS_get_asn1_element(&cert,&sigalg,0x20000010), iVar1 == 0)) {
    iVar1 = 0x70;
LAB_002a3579:
    ERR_put_error(0xc,0,0x6d,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x_x509.cc"
                  ,iVar1);
    return (X509 *)0x0;
  }
  iVar1 = CBS_get_any_ber_asn1_element(&cert,&sig,&tag,&header_len,(int *)0x0,&indefinite);
  if (((iVar1 == 0) || (tag != 3)) ||
     ((indefinite != 0 || ((iVar1 = CBS_skip(&sig,header_len), iVar1 == 0 || (cert.len != 0)))))) {
    iVar1 = 0x82;
    goto LAB_002a3579;
  }
  a = (X509 *)x509_new_null();
  if (a == (X509 *)0x0) {
    return (X509 *)0x0;
  }
  inp = tbs.data;
  iVar1 = ASN1_item_ex_d2i((ASN1_VALUE **)a,&inp,tbs.len,(ASN1_ITEM *)&X509_CINF_it,-1,0,'\0',
                           (ASN1_TLC *)buf);
  if ((iVar1 < 1) || (inp != tbs.data + tbs.len)) goto LAB_002a3552;
  inp = sigalg.data;
  pXVar2 = d2i_X509_ALGOR((X509_ALGOR **)0x0,&inp,sigalg.len);
  a->sig_alg = pXVar2;
  if ((pXVar2 == (X509_ALGOR *)0x0) || (inp != sigalg.data + sigalg.len)) goto LAB_002a3552;
  inp = sig.data;
  pAVar3 = c2i_ASN1_BIT_STRING((ASN1_BIT_STRING **)0x0,&inp,sig.len);
  a->signature = pAVar3;
  if ((pAVar3 == (ASN1_BIT_STRING *)0x0) || (inp != sig.data + sig.len)) goto LAB_002a3552;
  pXVar5 = a->cert_info;
  if (pXVar5->version == (ASN1_INTEGER *)0x0) {
LAB_002a365a:
    if ((pXVar5->issuerUID == (ASN1_BIT_STRING *)0x0) &&
       (pXVar5->subjectUID == (ASN1_BIT_STRING *)0x0)) {
LAB_002a3683:
      if (pXVar5->extensions == (stack_st_X509_EXTENSION *)0x0) {
        return (X509 *)a;
      }
      iVar1 = 0x8b;
      line = 0xb8;
    }
    else {
      iVar1 = 0x8b;
      line = 0xb2;
    }
  }
  else {
    uVar4 = ASN1_INTEGER_get(pXVar5->version);
    if (uVar4 < 3) {
      if (uVar4 == 0) {
        pXVar5 = a->cert_info;
        goto LAB_002a365a;
      }
      if (uVar4 == 2) {
        return (X509 *)a;
      }
      pXVar5 = a->cert_info;
      goto LAB_002a3683;
    }
    iVar1 = 0x8c;
    line = 0xaa;
  }
  ERR_put_error(0xb,0,iVar1,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x_x509.cc"
                ,line);
LAB_002a3552:
  X509_free(a);
  return (X509 *)0x0;
}

Assistant:

static X509 *x509_parse(CBS *cbs, CRYPTO_BUFFER *buf) {
  CBS cert, tbs, sigalg, sig;
  if (!CBS_get_asn1(cbs, &cert, CBS_ASN1_SEQUENCE) ||
      // Bound the length to comfortably fit in an int. Lengths in this
      // module often omit overflow checks.
      CBS_len(&cert) > INT_MAX / 2 ||
      !CBS_get_asn1_element(&cert, &tbs, CBS_ASN1_SEQUENCE) ||
      !CBS_get_asn1_element(&cert, &sigalg, CBS_ASN1_SEQUENCE)) {
    OPENSSL_PUT_ERROR(ASN1, ASN1_R_DECODE_ERROR);
    return nullptr;
  }

  // For just the signature field, we accept non-minimal BER lengths, though not
  // indefinite-length encoding. See b/18228011.
  //
  // TODO(crbug.com/boringssl/354): Switch the affected callers to convert the
  // certificate before parsing and then remove this workaround.
  CBS_ASN1_TAG tag;
  size_t header_len;
  int indefinite;
  if (!CBS_get_any_ber_asn1_element(&cert, &sig, &tag, &header_len,
                                    /*out_ber_found=*/nullptr,
                                    &indefinite) ||
      tag != CBS_ASN1_BITSTRING || indefinite ||  //
      !CBS_skip(&sig, header_len) ||              //
      CBS_len(&cert) != 0) {
    OPENSSL_PUT_ERROR(ASN1, ASN1_R_DECODE_ERROR);
    return nullptr;
  }

  bssl::UniquePtr<X509> ret(x509_new_null());
  if (ret == nullptr) {
    return nullptr;
  }

  // TODO(crbug.com/boringssl/443): When the rest of the library is decoupled
  // from the tasn_*.c implementation, replace this with |CBS|-based
  // functions.
  const uint8_t *inp = CBS_data(&tbs);
  if (ASN1_item_ex_d2i((ASN1_VALUE **)&ret->cert_info, &inp, CBS_len(&tbs),
                       ASN1_ITEM_rptr(X509_CINF), /*tag=*/-1,
                       /*aclass=*/0, /*opt=*/0, buf) <= 0 ||
      inp != CBS_data(&tbs) + CBS_len(&tbs)) {
    return nullptr;
  }

  inp = CBS_data(&sigalg);
  ret->sig_alg = d2i_X509_ALGOR(nullptr, &inp, CBS_len(&sigalg));
  if (ret->sig_alg == nullptr || inp != CBS_data(&sigalg) + CBS_len(&sigalg)) {
    return nullptr;
  }

  inp = CBS_data(&sig);
  ret->signature = c2i_ASN1_BIT_STRING(nullptr, &inp, CBS_len(&sig));
  if (ret->signature == nullptr || inp != CBS_data(&sig) + CBS_len(&sig)) {
    return nullptr;
  }

  // The version must be one of v1(0), v2(1), or v3(2).
  long version = X509_VERSION_1;
  if (ret->cert_info->version != nullptr) {
    version = ASN1_INTEGER_get(ret->cert_info->version);
    // TODO(https://crbug.com/boringssl/364): |X509_VERSION_1| should
    // also be rejected here. This means an explicitly-encoded X.509v1
    // version. v1 is DEFAULT, so DER requires it be omitted.
    if (version < X509_VERSION_1 || version > X509_VERSION_3) {
      OPENSSL_PUT_ERROR(X509, X509_R_INVALID_VERSION);
      return nullptr;
    }
  }

  // Per RFC 5280, section 4.1.2.8, these fields require v2 or v3.
  if (version == X509_VERSION_1 && (ret->cert_info->issuerUID != nullptr ||
                                    ret->cert_info->subjectUID != nullptr)) {
    OPENSSL_PUT_ERROR(X509, X509_R_INVALID_FIELD_FOR_VERSION);
    return nullptr;
  }

  // Per RFC 5280, section 4.1.2.9, extensions require v3.
  if (version != X509_VERSION_3 && ret->cert_info->extensions != nullptr) {
    OPENSSL_PUT_ERROR(X509, X509_R_INVALID_FIELD_FOR_VERSION);
    return nullptr;
  }

  return ret.release();
}